

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData *
cfd::core::CryptoUtil::DecryptAes256(ByteData *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  size_t sVar1;
  CfdException *pCVar2;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  int local_8c;
  undefined1 local_88 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  sVar1 = ByteData::GetDataSize(key);
  if (sVar1 != 0x20) {
    local_88._0_8_ = "cfdcore_util.cpp";
    local_88._8_4_ = 0x27d;
    local_88._16_8_ = "DecryptAes256";
    logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"wally_aes key size NG.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = local_88 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"DecryptAes256Cbc key size error.","");
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_88);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ByteData::GetDataSize(data);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,sVar1,
             (allocator_type *)local_88);
  ByteData::GetBytes(&local_38,key);
  ByteData::GetBytes(&local_50,data);
  local_8c = wally_aes(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_38.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_50.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_50.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,2,
                       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_68.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  if (local_8c == 0) {
    ByteData::ByteData(__return_storage_ptr__,&local_68);
    if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_88._0_8_ = "cfdcore_util.cpp";
  local_88._8_4_ = 0x28b;
  local_88._16_8_ = "DecryptAes256";
  logger::log<int&>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"wally_aes NG[{}].",&local_8c)
  ;
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_88._0_8_ = local_88 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"DecryptAes256 error.","");
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_88);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::DecryptAes256(const ByteData &key, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "DecryptAes256Cbc key size error.");
  }

  std::vector<uint8_t> output(data.GetDataSize());
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> value_data = data.GetBytes();

  // Decrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key_data.data(), key_data.size(), value_data.data(), value_data.size(),
      AES_FLAG_DECRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "DecryptAes256 error.");
  }

  return ByteData(output);
}